

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6850.cpp
# Opt level: O2

void __thiscall
Motorola::ACIA::ACIA::ACIA(ACIA *this,HalfCycles transmit_clock_rate,HalfCycles receive_clock_rate)

{
  (this->super_Source).observer_ = (Observer *)0x0;
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_preferred_clocking_0057c048;
  (this->super_ReadDelegate)._vptr_ReadDelegate = (_func_int **)&DAT_0057c068;
  Serial::Line<false>::Line(&this->receive);
  Serial::Line<false>::Line(&this->clear_to_send);
  Serial::Line<false>::Line(&this->data_carrier_detect);
  Serial::Line<false>::Line(&this->transmit);
  Serial::Line<false>::Line(&this->request_to_send);
  this->divider_ = 1;
  this->parity_ = None;
  this->data_bits_ = 7;
  this->stop_bits_ = 2;
  this->next_transmission_ = 0x100;
  this->received_data_ = 0x100;
  this->bits_received_ = 0;
  this->bits_incoming_ = 0;
  *(undefined4 *)((long)&this->bits_incoming_ + 3) = 0;
  (this->transmit_clock_rate_).super_WrappedInt<HalfCycles>.length_ =
       (IntType)transmit_clock_rate.super_WrappedInt<HalfCycles>.length_;
  if (receive_clock_rate.super_WrappedInt<HalfCycles>.length_ == 0) {
    receive_clock_rate.super_WrappedInt<HalfCycles>.length_ =
         transmit_clock_rate.super_WrappedInt<HalfCycles>.length_;
  }
  (this->receive_clock_rate_).super_WrappedInt<HalfCycles>.length_ =
       (IntType)receive_clock_rate.super_WrappedInt<HalfCycles>.length_;
  this->interrupt_line_ = false;
  this->interrupt_delegate_ = (InterruptDelegate *)0x0;
  Serial::Line<false>::set_writer_clock_rate(&this->transmit,transmit_clock_rate);
  Serial::Line<false>::set_writer_clock_rate(&this->request_to_send,transmit_clock_rate);
  return;
}

Assistant:

ACIA::ACIA(HalfCycles transmit_clock_rate, HalfCycles receive_clock_rate) :
	transmit_clock_rate_(transmit_clock_rate),
	receive_clock_rate_((receive_clock_rate != SameAsTransmit) ? receive_clock_rate : transmit_clock_rate) {
	transmit.set_writer_clock_rate(transmit_clock_rate);
	request_to_send.set_writer_clock_rate(transmit_clock_rate);
}